

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImDrawList *pIVar1;
  undefined4 uVar2;
  ImGuiContext *pIVar3;
  ImVec2 *pIVar4;
  ImVec2 *__src;
  uint uVar5;
  ImU32 col_00;
  int iVar6;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  char *text_end;
  void *pvVar7;
  undefined7 extraout_var_00;
  byte bVar8;
  char cVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db_00;
  ImVec2 IVar18;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  float extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  uint extraout_XMM0_Dd;
  undefined1 extraout_var_01 [12];
  undefined1 auVar19 [16];
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar28;
  uint uVar29;
  undefined1 auVar27 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float local_1fc;
  uint local_1f8;
  float local_1f4;
  float V;
  float local_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  ImGuiContext *g;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  ImVec2 current_off_unrotated;
  float afStack_1a0 [2];
  ImVec2 local_198;
  uint local_190;
  float local_18c;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  float vv;
  float fStack_154;
  ImVec2 local_150;
  float local_148;
  float fStack_144;
  uint uStack_140;
  uint uStack_13c;
  float uu;
  float fStack_134;
  ImVec2 local_130;
  ImDrawList *local_128;
  ImVec2 picker_pos;
  float ww;
  float fStack_104;
  ImVec2 *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  size_t local_a8;
  ImGuiWindow *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  uint uStack_60;
  uint uStack_5c;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trc;
  ImVec2 trb;
  undefined1 auVar20 [16];
  
  uStack_1d0 = g;
  g = GImGui;
  local_a0 = GImGui->CurrentWindow;
  local_a0->WriteAccessed = true;
  pIVar1 = local_a0->DrawList;
  local_78 = (ImVec2 *)ref_col;
  PushID(label);
  BeginGroup();
  uVar12 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar12);
  }
  pIVar3 = g;
  if ((flags & 0x6000000U) == 0) {
    uVar5 = g->ColorEditOptions & 0x6000000;
    uVar14 = 0x2000000;
    if (uVar5 != 0) {
      uVar14 = uVar5;
    }
    uVar12 = uVar12 | uVar14;
  }
  if ((uVar12 & 8) == 0) {
    uVar12 = uVar12 | g->ColorEditOptions & 0x10000U;
  }
  local_190 = uVar12 & 0x10002;
  bVar13 = local_190 == 0x10000;
  IVar18 = (local_a0->DC).CursorPos;
  local_128 = pIVar1;
  picker_pos = IVar18;
  local_100 = (ImVec2 *)col;
  local_148 = GetFrameHeight();
  fStack_144 = extraout_XMM0_Db;
  uStack_140 = extraout_XMM0_Dc;
  uStack_13c = extraout_XMM0_Dd;
  fVar16 = CalcItemWidth();
  pIVar4 = local_100;
  fVar17 = (pIVar3->Style).ItemInnerSpacing.x;
  fVar16 = fVar16 - (local_148 + fVar17) * (float)(byte)(bVar13 + 1);
  uVar14 = -(uint)(fVar16 <= local_148);
  fVar28 = (float)(extraout_var_01._0_4_ & (uint)fStack_144);
  uVar5 = extraout_var_01._4_4_ & uStack_140;
  uVar29 = extraout_var_01._8_4_ & uStack_13c;
  fVar25 = (float)(uVar14 & (uint)local_148 | ~uVar14 & (uint)fVar16);
  local_a8 = (ulong)((uVar12 & 2) == 0) * 4 + 0xc;
  memcpy(backup_initial_col,local_100,local_a8);
  local_1ec = fVar25 * 0.08;
  local_88 = ZEXT416((uint)(fVar25 * 0.5));
  fVar26 = fVar25 * 0.5 - local_1ec;
  _local_b8 = ZEXT416((uint)fVar26);
  fVar16 = IVar18.x;
  local_68 = fVar25 + fVar16;
  _local_1c8 = ZEXT416((uint)(fVar17 + local_68));
  local_1b8._4_4_ = fStack_144;
  local_1b8._0_4_ = local_148 + fVar17 + local_68;
  fStack_1b0 = (float)uStack_140;
  fStack_1ac = (float)uStack_13c;
  local_198.x = (local_148 + fVar25) * 0.5 + fVar16;
  fVar30 = IVar18.y;
  local_198.y = fVar25 * 0.5 + fVar30;
  local_1e8._4_4_ = local_198.y;
  local_1e8._0_4_ = local_198.x;
  fStack_1e0 = fStack_144 * 0.0 + 0.0;
  fStack_1dc = fVar28 * 0.0 + 0.0;
  triangle_pa.x = fVar26 - (float)(int)(fVar25 * 0.027);
  triangle_pa.y = 0.0;
  local_150.x = triangle_pa.x * -0.5;
  local_150.y = triangle_pa.x * -0.866025;
  triangle_pc.y = triangle_pa.x * 0.866025;
  local_18c = fVar16;
  triangle_pc.x = local_150.x;
  fStack_64 = fVar28;
  uStack_60 = uVar5;
  uStack_5c = uVar29;
  ColorConvertRGBtoHSV(pIVar4->x,pIVar4->y,pIVar4[1].x,&local_1fc,&local_1f4,&V);
  PushItemFlag(8,true);
  local_e8._4_4_ = fVar30;
  local_e8._0_4_ = fVar30;
  fStack_e0 = fVar30;
  fStack_dc = fVar30;
  local_c8 = fVar30;
  fStack_c4 = fVar30;
  fStack_c0 = fVar30;
  fStack_bc = fVar30;
  if ((uVar12 >> 0x1a & 1) == 0) {
    if ((uVar12 >> 0x19 & 1) == 0) {
      uVar10 = 0;
      local_1f8 = 0;
      local_1e8._0_4_ = 0;
    }
    else {
      current_off_unrotated.y = fVar25;
      current_off_unrotated.x = fVar25;
      InvisibleButton("sv",&current_off_unrotated);
      bVar13 = IsItemActive();
      if (bVar13) {
        auVar19._0_4_ = fVar25 + -1.0;
        IVar18 = (pIVar3->IO).MousePos;
        auVar31._0_4_ = IVar18.x - fVar16;
        auVar31._4_4_ = IVar18.y - fVar30;
        auVar31._8_8_ = 0;
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_4_ = auVar19._0_4_;
        auVar19._12_4_ = auVar19._0_4_;
        auVar19 = divps(auVar31,auVar19);
        fVar16 = auVar19._4_4_;
        iVar6 = -(uint)(1.0 < auVar19._0_4_);
        iVar15 = -(uint)(1.0 < fVar16);
        auVar21._4_4_ = iVar15;
        auVar21._0_4_ = iVar6;
        auVar21._8_4_ = iVar15;
        auVar21._12_4_ = iVar15;
        auVar20._8_8_ = auVar21._8_8_;
        auVar20._4_4_ = iVar6;
        auVar20._0_4_ = iVar6;
        uVar14 = movmskpd((int)CONCAT71(extraout_var,bVar13),auVar20);
        auVar31 = ZEXT816(0x3f800000);
        if ((uVar14 & 1) == 0) {
          auVar31 = auVar19;
        }
        local_1f4 = (float)(~-(uint)(auVar19._0_4_ < 0.0) & auVar31._0_4_);
        fVar26 = 0.0;
        if ((uVar14 & 2) == 0) {
          fVar26 = 1.0 - fVar16;
        }
        V = (float)(-(uint)(fVar16 < 0.0) & 0x3f800000 | ~-(uint)(fVar16 < 0.0) & (uint)fVar26);
        uVar10 = 1;
      }
      else {
        uVar10 = 0;
      }
      if ((uVar12 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      current_off_unrotated.y = (float)local_e8._0_4_;
      current_off_unrotated.x = (float)local_1c8._0_4_;
      SetCursorScreenPos(&current_off_unrotated);
      current_off_unrotated.y = fVar25;
      current_off_unrotated.x = local_148;
      InvisibleButton("hue",&current_off_unrotated);
      bVar13 = IsItemActive();
      if (bVar13) {
        fVar16 = ((g->IO).MousePos.y - local_c8) / (fVar25 + -1.0);
        local_1fc = 1.0;
        if (fVar16 <= 1.0) {
          local_1fc = fVar16;
        }
        local_1fc = (float)(~-(uint)(fVar16 < 0.0) & (uint)local_1fc);
        local_1f8 = (uint)CONCAT71(g._1_7_,1);
        uVar14 = (uint)CONCAT71(g._1_7_,1);
      }
      else {
        local_1f8 = 0;
        uVar14 = (uint)uVar10;
      }
      local_1e8._0_4_ = uVar14;
    }
  }
  else {
    current_off_unrotated.y = fVar25;
    current_off_unrotated.x = (pIVar3->Style).ItemInnerSpacing.x + fVar25 + local_148;
    InvisibleButton("hsv",&current_off_unrotated);
    bVar13 = IsItemActive();
    if (bVar13) {
      fVar33 = (pIVar3->IO).MouseClickedPos[0].x - (float)local_1e8._0_4_;
      fVar30 = (pIVar3->IO).MouseClickedPos[0].y - (float)local_1e8._4_4_;
      local_f8 = ZEXT416((uint)fVar30);
      fVar26 = (pIVar3->IO).MousePos.x - (float)local_1e8._0_4_;
      local_d8 = ZEXT416((uint)fVar26);
      fVar16 = (pIVar3->IO).MousePos.y - (float)local_1e8._4_4_;
      local_98 = ZEXT416((uint)fVar16);
      _local_1e8 = ZEXT416((uint)fVar33);
      fVar30 = fVar33 * fVar33 + fVar30 * fVar30;
      if ((fVar30 < ((float)local_b8._0_4_ + -1.0) * ((float)local_b8._0_4_ + -1.0)) ||
         (((float)local_88._0_4_ + 1.0) * ((float)local_88._0_4_ + 1.0) < fVar30)) {
        local_1f8 = 0;
      }
      else {
        fVar16 = atan2f(fVar16,fVar26);
        fVar16 = (fVar16 / 3.1415927) * 0.5;
        local_1fc = (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar16 |
                           (uint)(fVar16 + 1.0) & -(uint)(fVar16 < 0.0));
        local_1f8 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      fVar16 = cosf(local_1fc * -2.0 * 3.1415927);
      fVar26 = sinf(local_1fc * -2.0 * 3.1415927);
      uVar2 = local_1e8._0_4_;
      local_1e8._4_4_ = extraout_XMM0_Db_00;
      local_1e8._0_4_ = fVar26;
      fStack_1e0 = (float)extraout_XMM0_Dc_00;
      fStack_1dc = (float)extraout_XMM0_Dd_00;
      current_off_unrotated.y = fVar26 * (float)uVar2 + fVar16 * (float)local_f8._0_4_;
      current_off_unrotated.x = fVar16 * (float)uVar2 + -(float)local_f8._0_4_ * fVar26;
      bVar13 = ImTriangleContainsPoint(&triangle_pa,&local_150,&triangle_pc,&current_off_unrotated);
      if (bVar13) {
        current_off_unrotated.x =
             fVar16 * (float)local_d8._0_4_ + -(float)local_98._0_4_ * (float)local_1e8._0_4_;
        current_off_unrotated.y =
             (float)local_1e8._0_4_ * (float)local_d8._0_4_ + fVar16 * (float)local_98._0_4_;
        bVar13 = ImTriangleContainsPoint
                           (&triangle_pa,&local_150,&triangle_pc,&current_off_unrotated);
        if (!bVar13) {
          current_off_unrotated =
               ImTriangleClosestPoint(&triangle_pa,&local_150,&triangle_pc,&current_off_unrotated);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_150,&triangle_pc,&current_off_unrotated,&uu,&vv,&ww);
        fVar26 = 1.0 - vv;
        fVar16 = 1.0;
        if (fVar26 <= 1.0) {
          fVar16 = fVar26;
        }
        V = (float)(-(uint)(fVar26 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar26 < 0.0001) & (uint)fVar16
                   );
        fVar26 = uu / V;
        fVar16 = 1.0;
        if (fVar26 <= 1.0) {
          fVar16 = fVar26;
        }
        local_1f4 = (float)(-(uint)(fVar26 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar26 < 0.0001) & (uint)fVar16);
        uVar10 = CONCAT71((int7)((ulong)&vv >> 8),1);
        uVar14 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      }
      else {
        uVar10 = 0;
        uVar14 = local_1f8;
      }
      local_1e8._0_4_ = uVar14;
    }
    else {
      uVar10 = 0;
      local_1f8 = 0;
      local_1e8._0_4_ = 0;
    }
    if ((uVar12 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  fVar17 = fVar17 + (float)local_1b8._0_4_;
  if (local_190 == 0x10000) {
    current_off_unrotated.y = (float)local_e8._0_4_;
    current_off_unrotated.x = fVar17;
    SetCursorScreenPos(&current_off_unrotated);
    current_off_unrotated.y = fVar25;
    current_off_unrotated.x = local_148;
    InvisibleButton("alpha",&current_off_unrotated);
    bVar13 = IsItemActive();
    if (bVar13) {
      fVar26 = ((g->IO).MousePos.y - local_c8) / (fVar25 + -1.0);
      fVar16 = 1.0;
      if (fVar26 <= 1.0) {
        fVar16 = fVar26;
      }
      pIVar4[1].y = (float)(-(uint)(fVar26 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar26 < 0.0) & (uint)(1.0 - fVar16));
      local_1e8._0_4_ = (undefined4)CONCAT71(g._1_7_,1);
    }
  }
  PopItemFlag();
  if ((uVar12 >> 8 & 1) == 0) {
    SameLine(0.0,(g->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar12) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar12 >> 8 & 1) != 0) {
      SameLine(0.0,(g->Style).ItemInnerSpacing.x);
    }
    TextUnformatted(label,text_end);
  }
  fVar16 = local_148 * 0.2;
  if ((uVar12 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    __src = local_78;
    current_off_unrotated = *pIVar4;
    if ((uVar12 & 2) == 0) {
      afStack_1a0[1] = pIVar4[1].y;
    }
    else {
      afStack_1a0[1] = 1.0;
    }
    afStack_1a0[0] = pIVar4[1].x;
    if ((char)uVar12 < '\0') {
      Text("Current");
    }
    IVar18.x = local_148 * 3.0;
    IVar18.y = local_148 * 2.0;
    fStack_e0 = local_148 * 0.0;
    local_e8._0_4_ = IVar18.x;
    local_e8._4_4_ = IVar18.y;
    fStack_dc = local_148 * 0.0;
    ColorButton("##current",(ImVec4 *)&current_off_unrotated,uVar12 & 0xe0040,IVar18);
    if (__src != (ImVec2 *)0x0) {
      Text("Original");
      _uu = *__src;
      if ((uVar12 & 2) == 0) {
        local_130.y = __src[1].y;
      }
      else {
        local_130.y = 1.0;
      }
      local_130.x = __src[1].x;
      bVar13 = ColorButton("##original",(ImVec4 *)&uu,uVar12 & 0xe0040,(ImVec2)local_e8);
      if (bVar13) {
        pvVar7 = memcpy(pIVar4,__src,local_a8);
        local_1e8._0_4_ = (undefined4)CONCAT71((int7)((ulong)pvVar7 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if (((char)local_1f8 != '\0') || ((char)uVar10 != '\0')) {
    ColorConvertHSVtoRGB
              ((float)(~-(uint)(1.0 <= local_1fc) & (uint)local_1fc |
                      (uint)(local_1fc + -1e-05) & -(uint)(1.0 <= local_1fc)),
               (float)(~-(uint)(0.0 < local_1f4) & 0x3727c5ac |
                      (uint)local_1f4 & -(uint)(0.0 < local_1f4)),
               (float)(~-(uint)(0.0 < V) & 0x358637bd | (uint)V & -(uint)(0.0 < V)),&pIVar4->x,
               &pIVar4->y,&pIVar4[1].x);
  }
  local_98 = ZEXT416((uint)(float)(int)fVar16);
  local_f8._0_4_ = (int)uVar10;
  if ((uVar12 & 0x20) == 0) {
    fVar16 = fVar17;
    if (local_190 != 0x10000) {
      fVar16 = (float)local_1c8._0_4_;
    }
    PushItemWidth((fVar16 + local_148) - local_18c);
    uVar14 = uVar12 & 0x18e001a;
    if (((uVar12 >> 0x14 & 1) == 0 && (uVar12 & 0x600000) != 0) ||
       (bVar13 = ColorEdit4("##rgb",&pIVar4->x,uVar14 | 0x100004), !bVar13)) {
LAB_00144991:
      bVar8 = 0;
    }
    else {
      local_1e8._0_4_ = (undefined4)CONCAT71(extraout_var_00,1);
      if (g->ActiveId == 0) goto LAB_00144991;
      bVar8 = g->ActiveIdAllowOverlap ^ 1;
    }
    if ((uVar12 >> 0x15 & 1) != 0 || (uVar12 & 0x500000) == 0) {
      bVar13 = ColorEdit4("##hsv",&pIVar4->x,uVar14 | 0x200004);
      local_1e8._0_4_ = CONCAT31(SUB43(local_1e8._0_4_,1),(byte)local_1e8._0_4_ | bVar13);
    }
    if ((uVar12 >> 0x16 & 1) != 0 || (uVar12 & 0x300000) == 0) {
      bVar13 = ColorEdit4("##hex",&pIVar4->x,uVar14 | 0x400004);
      local_1e8._0_4_ = CONCAT31(SUB43(local_1e8._0_4_,1),(byte)local_1e8._0_4_ | bVar13);
    }
    uVar10 = (ulong)(uint)local_f8._0_4_;
    PopItemWidth();
    if (bVar8 != 0) {
      ColorConvertRGBtoHSV(pIVar4->x,pIVar4->y,pIVar4[1].x,&current_off_unrotated.x,&uu,&vv);
      if ((current_off_unrotated.x <= 0.0) && (0.0 < local_1fc)) {
        if (0.0 < vv) {
LAB_00144a84:
          if (0.0 < uu) goto LAB_00144aaa;
          fVar16 = local_1f4 * 0.5;
        }
        else {
          if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_00144a84;
          vv = V * 0.5;
          fVar16 = local_1f4;
        }
        ColorConvertHSVtoRGB(local_1fc,fVar16,vv,&pIVar4->x,&pIVar4->y,&pIVar4[1].x);
      }
    }
  }
LAB_00144aaa:
  cVar9 = (char)uVar10;
  current_off_unrotated.x = 1.0;
  current_off_unrotated.y = 1.0;
  afStack_1a0[0] = 1.0;
  afStack_1a0[1] = 1.0;
  ColorConvertHSVtoRGB
            (local_1fc,1.0,1.0,(float *)&current_off_unrotated,&current_off_unrotated.y,afStack_1a0)
  ;
  fVar16 = (float)ColorConvertFloat4ToU32((ImVec4 *)&current_off_unrotated);
  _uu = *local_100;
  local_130.y = 1.0;
  local_130.x = local_100[1].x;
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)&uu);
  pIVar1 = local_128;
  vv = 0.0;
  fStack_154 = 0.0;
  if ((uVar12 >> 0x1a & 1) == 0) {
    if ((uVar12 >> 0x19 & 1) == 0) goto LAB_001452b4;
    local_d8._0_4_ = col_00;
    fStack_134 = local_c8 + fVar25;
    uu = local_68;
    ImDrawList::AddRectFilledMultiColor
              (local_128,&picker_pos,(ImVec2 *)&uu,0xffffffff,(ImU32)fVar16,(ImU32)fVar16,0xffffffff
              );
    g = (ImGuiContext *)CONCAT44(fVar25,fVar25);
    uStack_1d0._0_4_ = fVar25;
    uStack_1d0._4_4_ = fVar25;
    uu = picker_pos.x + fVar25;
    fStack_134 = picker_pos.y + fVar25;
    ImDrawList::AddRectFilledMultiColor(pIVar1,&picker_pos,(ImVec2 *)&uu,0,0,0xff000000,0xff000000);
    p_max.x = g._0_4_ + picker_pos.x;
    p_max.y = g._4_4_ + picker_pos.y;
    RenderFrameBorder(picker_pos,p_max,0.0);
    auVar27._4_4_ = 1.0 - V;
    auVar27._0_4_ = local_1f4;
    auVar27._8_8_ = 0;
    auVar31 = minps(_DAT_00188d30,auVar27);
    fVar16 = picker_pos.x;
    fVar26 = picker_pos.y;
    auVar32._0_4_ = g._0_4_ + fVar16 + -2.0;
    auVar32._4_4_ = g._4_4_ + fVar26 + -2.0;
    auVar32._8_4_ = (float)uStack_1d0 + 0.0 + 0.0;
    auVar32._12_4_ = uStack_1d0._4_4_ + 0.0 + 0.0;
    auVar22._0_4_ =
         (float)(int)((float)(-(uint)(0.0 <= local_1f4) & auVar31._0_4_) * g._0_4_ + fVar16 + 0.5);
    auVar22._4_4_ =
         (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar31._4_4_) * g._4_4_ + fVar26 + 0.5);
    auVar22._8_4_ = (float)(int)(auVar31._8_4_ * (float)uStack_1d0 + 0.0 + 0.0);
    auVar22._12_4_ = (float)(int)(auVar31._12_4_ * uStack_1d0._4_4_ + 0.0 + 0.0);
    auVar31 = minps(auVar32,auVar22);
    uVar12 = -(uint)(auVar22._0_4_ < fVar16 + 2.0);
    uVar14 = -(uint)(auVar22._4_4_ < fVar26 + 2.0);
    _vv = (ImVec2)(CONCAT44(~uVar14 & auVar31._4_4_,~uVar12 & auVar31._0_4_) |
                  CONCAT44((uint)(fVar26 + 2.0) & uVar14,(uint)(fVar16 + 2.0) & uVar12));
    g = (ImGuiContext *)CONCAT44(fVar28,fVar25 / 6.0);
    uStack_1d0._0_4_ = (float)uVar5;
    uStack_1d0._4_4_ = (float)uVar29;
    lVar11 = 0;
    while( true ) {
      if (lVar11 == 6) break;
      fStack_134 = (float)(int)lVar11 * g._0_4_ + picker_pos.y;
      uu = (float)local_1c8._0_4_;
      fStack_104 = (float)(int)(lVar11 + 1) * g._0_4_ + picker_pos.y;
      ww = (float)local_1b8._0_4_;
      ImDrawList::AddRectFilledMultiColor
                (pIVar1,(ImVec2 *)&uu,(ImVec2 *)&ww,(&DAT_001907b0)[lVar11],(&DAT_001907b0)[lVar11],
                 (&DAT_001907b4)[lVar11],(&DAT_001907b4)[lVar11]);
      lVar11 = lVar11 + 1;
    }
    _g = ZEXT416((uint)(float)(int)(local_1fc * fVar25 + picker_pos.y + 0.5));
    p_min.y = picker_pos.y;
    p_min.x = (float)local_1c8._0_4_;
    p_max_00.y = fVar25 + picker_pos.y;
    p_max_00.x = (float)local_1b8._0_4_;
    RenderFrameBorder(p_min,p_max_00,0.0);
    pos.x = (float)local_1c8._0_4_ + -1.0;
    pos.y = g._0_4_;
    half_sz.x = (float)local_98._0_4_ + 1.0;
    half_sz.y = (float)local_98._0_4_;
    RenderArrowsForVerticalBar(pIVar1,pos,half_sz,local_148 + 2.0);
  }
  else {
    local_d8._0_4_ = col_00;
    _local_e8 = ZEXT416((uint)(1.5 / (float)local_88._0_4_));
    local_c8 = 5.60519e-45;
    if (4 < (int)(float)local_88._0_4_ / 0xc) {
      local_c8 = (float)((int)(float)local_88._0_4_ / 0xc);
    }
    local_78 = (ImVec2 *)CONCAT44(0x80000000,-(1.5 / (float)local_88._0_4_));
    uStack_70 = 0x80000000;
    uStack_6c = 0x80000000;
    local_88._0_4_ = (float)local_88._0_4_ + (float)local_b8._0_4_;
    local_18c = (float)local_88._0_4_ * 0.5;
    local_b8._4_4_ = local_b8._0_4_;
    fStack_b0 = (float)local_b8._0_4_;
    fStack_ac = (float)local_b8._0_4_;
    local_68 = fVar16;
    for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
      fVar16 = (float)(int)lVar11 / 6.0;
      fVar26 = (fVar16 + fVar16) * 3.1415927 + (float)local_78;
      fVar16 = ((float)(int)lVar11 + 1.0) / 6.0;
      fVar16 = (fVar16 + fVar16) * 3.1415927 + (float)local_e8._0_4_;
      g._0_4_ = fVar16;
      iVar6 = (pIVar1->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar1,&local_198,local_18c,fVar26,fVar16,(int)local_c8);
      ImDrawList::PathStroke(pIVar1,0xffffffff,false,local_1ec);
      iVar15 = (pIVar1->VtxBuffer).Size;
      _local_1c8 = ZEXT416((uint)local_198.x);
      local_1b8._0_4_ = cosf(fVar26);
      local_1b8._4_4_ = extraout_XMM0_Db_01;
      fStack_1b0 = (float)extraout_XMM0_Dc_01;
      fStack_1ac = (float)extraout_XMM0_Dd_01;
      auVar23._4_4_ = local_198.y;
      auVar23._0_4_ = local_1c8._0_4_;
      auVar23._8_4_ = local_1c8._4_4_;
      auVar23._12_4_ = 0;
      _local_1c8 = auVar23;
      fVar16 = sinf(fVar26);
      fVar26 = (float)local_1b8._4_4_ * fStack_b0;
      local_1b8._4_4_ = fVar16 * (float)local_b8._4_4_ + (float)local_1c8._4_4_;
      local_1b8._0_4_ = (float)local_1b8._0_4_ * (float)local_b8._0_4_ + (float)local_1c8._0_4_;
      fStack_1b0 = fVar26 + fStack_1c0;
      fStack_1ac = extraout_XMM0_Db_02 * fStack_ac + fStack_1bc;
      _local_1c8 = ZEXT416((uint)local_198.x);
      fVar16 = cosf(g._0_4_);
      auVar24._4_4_ = local_198.y;
      auVar24._0_4_ = local_1c8._0_4_;
      auVar24._8_4_ = local_1c8._4_4_;
      auVar24._12_4_ = 0;
      _local_1c8 = auVar24;
      fVar26 = sinf(g._0_4_);
      gradient_p1.x = fVar16 * (float)local_b8._0_4_ + (float)local_1c8._0_4_;
      gradient_p1.y = fVar26 * (float)local_b8._4_4_ + (float)local_1c8._4_4_;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar1,iVar6,iVar15,(ImVec2)local_1b8,gradient_p1,(&DAT_001907b0)[lVar11],
                 (&DAT_001907b4)[lVar11]);
    }
    local_1b8._0_4_ = cosf((local_1fc + local_1fc) * 3.1415927);
    local_1b8._4_4_ = extraout_XMM0_Db_03;
    fStack_1b0 = (float)extraout_XMM0_Dc_02;
    fStack_1ac = (float)extraout_XMM0_Dd_02;
    local_1c8._0_4_ = sinf((local_1fc + local_1fc) * 3.1415927);
    fVar16 = local_68;
    pIVar1 = local_128;
    local_1c8._4_4_ = extraout_XMM0_Db_04;
    fStack_1c0 = (float)extraout_XMM0_Dc_03;
    fStack_1bc = (float)extraout_XMM0_Dd_03;
    uu = (float)local_1b8._0_4_ * (float)local_88._0_4_ * 0.5 + local_198.x;
    fStack_134 = (float)local_1c8._0_4_ * (float)local_88._0_4_ * 0.5 + local_198.y;
    if ((char)local_1f8 == '\0') {
      fVar26 = 0.55;
    }
    else {
      fVar26 = 0.65;
    }
    local_1ec = local_1ec * fVar26;
    iVar6 = 0x20;
    if ((int)(local_1ec / 1.4) < 0x20) {
      iVar6 = (int)(local_1ec / 1.4);
    }
    iVar15 = 9;
    if (9 < iVar6) {
      iVar15 = iVar6;
    }
    ImDrawList::AddCircleFilled(local_128,(ImVec2 *)&uu,local_1ec,(ImU32)local_68,iVar15);
    ImDrawList::AddCircle(pIVar1,(ImVec2 *)&uu,local_1ec + 1.0,0xff808080,iVar15,1.0);
    ImDrawList::AddCircle(pIVar1,(ImVec2 *)&uu,local_1ec,0xffffffff,iVar15,1.0);
    ww = triangle_pa.x * (float)local_1b8._0_4_ + -triangle_pa.y * (float)local_1c8._0_4_ +
         local_198.x;
    fStack_104 = triangle_pa.x * (float)local_1c8._0_4_ + triangle_pa.y * (float)local_1b8._0_4_ +
                 local_198.y;
    trb.x = local_150.x * (float)local_1b8._0_4_ + -local_150.y * (float)local_1c8._0_4_ +
            local_198.x;
    trb.y = local_150.x * (float)local_1c8._0_4_ + local_150.y * (float)local_1b8._0_4_ +
            local_198.y;
    trc.x = triangle_pc.x * (float)local_1b8._0_4_ + -triangle_pc.y * (float)local_1c8._0_4_ +
            local_198.x;
    trc.y = triangle_pc.x * (float)local_1c8._0_4_ + triangle_pc.y * (float)local_1b8._0_4_ +
            local_198.y;
    uv_white = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(pIVar1,6,6);
    ImDrawList::PrimVtx(pIVar1,(ImVec2 *)&ww,&uv_white,(ImU32)fVar16);
    ImDrawList::PrimVtx(pIVar1,&trb,&uv_white,(ImU32)fVar16);
    ImDrawList::PrimVtx(pIVar1,&trc,&uv_white,0xffffffff);
    ImDrawList::PrimVtx(pIVar1,(ImVec2 *)&ww,&uv_white,0);
    ImDrawList::PrimVtx(pIVar1,&trb,&uv_white,0xff000000);
    ImDrawList::PrimVtx(pIVar1,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar1,(ImVec2 *)&ww,&trb,&trc,0xff808080,1.5);
    fVar16 = 1.0;
    if (local_1f4 <= 1.0) {
      fVar16 = local_1f4;
    }
    fVar16 = (float)(~-(uint)(local_1f4 < 0.0) & (uint)fVar16);
    fVar28 = 1.0 - V;
    fVar26 = 1.0;
    if (fVar28 <= 1.0) {
      fVar26 = fVar28;
    }
    fVar26 = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar26);
    fVar28 = fVar16 * (ww - trc.x) + trc.x;
    fVar16 = fVar16 * (ww._4_4_ - trc.y) + trc.y;
    vv = fVar26 * (trb.x - fVar28) + fVar28;
    fStack_154 = fVar26 * (trb.y - fVar16) + fVar16;
  }
  cVar9 = local_f8[0];
  col_00 = local_d8._0_4_;
LAB_001452b4:
  pIVar1 = local_128;
  if (cVar9 == '\0') {
    fVar16 = 6.0;
  }
  else {
    fVar16 = 10.0;
  }
  local_1b8._0_4_ = fVar16;
  ImDrawList::AddCircleFilled(local_128,(ImVec2 *)&vv,fVar16,col_00,0xc);
  ImDrawList::AddCircle(pIVar1,(ImVec2 *)&vv,(float)local_1b8._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(pIVar1,(ImVec2 *)&vv,(float)local_1b8._0_4_,0xffffffff,0xc,1.0);
  pIVar4 = local_100;
  if (local_190 == 0x10000) {
    fVar16 = local_100[1].y;
    _local_1c8 = ZEXT416((uint)fVar16);
    fVar26 = 1.0;
    if (fVar16 <= 1.0) {
      fVar26 = fVar16;
    }
    _local_1b8 = ZEXT416((uint)(1.0 - fVar26));
    fStack_134 = picker_pos.y;
    uu = fVar17;
    local_130.x = fVar17 + local_148;
    local_130.y = picker_pos.y + fVar25;
    RenderColorRectWithAlphaCheckerboard
              (_uu,local_130,0,(local_130.x - fVar17) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar1,(ImVec2 *)&uu,&local_130,col_00,col_00,col_00 & 0xffffff,col_00 & 0xffffff);
    local_1b8._4_4_ = (float)(int)(float)(~local_1c8._4_4_ & local_1b8._4_4_);
    local_1b8._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1c8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1c8._0_4_ < 0.0) & local_1b8._0_4_) * fVar25 +
                      picker_pos.y + 0.5);
    fStack_1b0 = (float)(int)(float)(~(uint)fStack_1c0 & (uint)fStack_1b0);
    fStack_1ac = (float)(int)(float)(~(uint)fStack_1bc & (uint)fStack_1ac);
    RenderFrameBorder(_uu,local_130,0.0);
    pos_00.x = fVar17 + -1.0;
    pos_00.y = (float)local_1b8._0_4_;
    half_sz_00.x = (float)local_98._0_4_ + 1.0;
    half_sz_00.y = (float)local_98._0_4_;
    RenderArrowsForVerticalBar(pIVar1,pos_00,half_sz_00,local_148 + 2.0);
  }
  EndGroup();
  uVar2 = local_1e8._0_4_;
  uVar12 = local_1e8._0_4_;
  if ((char)local_1e8._0_4_ != '\0') {
    iVar6 = bcmp(backup_initial_col,pIVar4,local_a8);
    uVar12 = uVar2 & 0xff;
    if (iVar6 == 0) {
      uVar12 = 0;
    }
  }
  if ((uVar12 & 1) != 0) {
    MarkItemEdited((local_a0->DC).LastItemId);
  }
  PopID();
  return (bool)((byte)uVar12 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}